

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addXnor(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *G;
  DdNode *F;
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  pDVar1 = *f;
  pDVar2 = *g;
  if (pDVar1 == pDVar2) {
    dd_local = (DdManager *)dd->one;
  }
  else if ((pDVar1 == dd->one) && (pDVar2 == dd->one)) {
    dd_local = (DdManager *)dd->one;
  }
  else if ((pDVar2 == dd->zero) && (pDVar1 == dd->zero)) {
    dd_local = (DdManager *)dd->one;
  }
  else if ((pDVar1->index == 0x7fffffff) && (pDVar2->index == 0x7fffffff)) {
    dd_local = (DdManager *)dd->zero;
  }
  else {
    if (pDVar2 < pDVar1) {
      *f = pDVar2;
      *g = pDVar1;
    }
    dd_local = (DdManager *)0x0;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addXnor(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == G) return(DD_ONE(dd));
    if (F == DD_ONE(dd) && G == DD_ONE(dd)) return(DD_ONE(dd));
    if (G == DD_ZERO(dd) && F == DD_ZERO(dd)) return(DD_ONE(dd));
    if (cuddIsConstant(F) && cuddIsConstant(G)) return(DD_ZERO(dd));
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}